

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void Map_Push(Map *tree,void *str,size_t size,void *id)

{
  Map *pMVar1;
  size_t sVar2;
  
  if (size != 0) {
    sVar2 = 0;
    do {
      pMVar1 = tree->delta[*(byte *)((long)str + sVar2)];
      if (pMVar1 == (Map *)0x0) {
        if (size != sVar2) {
          pMVar1 = tree;
          if (sVar2 < size) {
            do {
              tree = (Map *)calloc(1,0x810);
              pMVar1->delta[*(byte *)((long)str + sVar2)] = tree;
              sVar2 = sVar2 + 1;
              pMVar1 = tree;
            } while (size != sVar2);
          }
          goto LAB_001437a0;
        }
        break;
      }
      sVar2 = sVar2 + 1;
      tree = pMVar1;
    } while (size != sVar2);
  }
  if (tree->ID != (void *)0x0) {
    __assert_fail("tree->ID==NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/misc/map.c"
                  ,0x29,"void Map_Push(Map *, void *, size_t, void *)");
  }
LAB_001437a0:
  tree->ID = id;
  tree->is_final = '\x01';
  return;
}

Assistant:

void Map_Push(Map *tree,void *str,size_t size,void *id)
{
	size_t temp;
	Map_Scour(tree,str,size,&temp,&tree);	

	if(temp == size)
	{
		assert(tree->ID==NULL);
		tree->ID=id;
		tree->is_final=1;
		return;
	}
	for(temp;temp<size;++temp)
	{
		tree=tree->delta[((unsigned char*)str)[temp]]=calloc(1,sizeof(Map));
		/*
		Map_Init(
			tree=tree->delta[((unsigned char*)str)[temp]]=malloc(sizeof(Map))
			);
			*/
	}

	tree->ID=id;
	tree->is_final=1;

}